

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_stack.cpp
# Opt level: O3

void use_stack(void)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  char *pcVar6;
  ostream *poVar7;
  char ch;
  unsigned_long po;
  Stack st;
  byte local_92 [2];
  Item local_90;
  Stack local_88;
  
  L10_3::Stack::Stack(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Please enter A to add a purchase order, \nP to process a PO, or Q to quit.\n",0x4a);
  piVar4 = std::operator>>((istream *)&std::cin,(char *)local_92);
  if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
    do {
      iVar3 = toupper((int)(char)local_92[0]);
      if (iVar3 == 0x51) break;
      do {
        iVar3 = std::istream::get();
        bVar1 = local_92[0];
      } while (iVar3 != 10);
      iVar3 = isalpha((int)(char)local_92[0]);
      if (iVar3 == 0) {
        local_92[1] = 7;
        lVar5 = 1;
        pcVar6 = (char *)(local_92 + 1);
      }
      else {
        if (bVar1 < 0x61) {
          if (bVar1 == 0x41) {
LAB_0010f039:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Enter a PO number to add: ",0x1a);
            std::istream::_M_extract<unsigned_long>(&std::cin);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"You entered: ",0xd);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            bVar2 = L10_3::Stack::is_full(&local_88);
            if (bVar2) {
              lVar5 = 0x14;
              poVar7 = (ostream *)&std::cout;
              pcVar6 = "Stack already full.\n";
              goto LAB_0010f10f;
            }
            L10_3::Stack::push(&local_88,&local_90);
          }
          else if (bVar1 == 0x50) goto LAB_0010f0aa;
        }
        else {
          if (bVar1 != 0x70) {
            if (bVar1 != 0x61) goto LAB_0010f114;
            goto LAB_0010f039;
          }
LAB_0010f0aa:
          bVar2 = L10_3::Stack::is_empty(&local_88);
          if (bVar2) {
            lVar5 = 0x17;
            poVar7 = (ostream *)&std::cout;
            pcVar6 = "Stack already cleared.\n";
          }
          else {
            L10_3::Stack::pop(&local_88,&local_90);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Po #",4);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            lVar5 = 0xc;
            pcVar6 = " processed.\n";
          }
LAB_0010f10f:
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,lVar5);
        }
LAB_0010f114:
        lVar5 = 0x4a;
        pcVar6 = "Please enter A to add a purchase order, \nP to process a PO, or Q to quit.\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
      piVar4 = std::operator>>((istream *)&std::cin,(char *)local_92);
    } while (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye!\n",5);
  return;
}

Assistant:

void use_stack() {
    using namespace L10_3;
    using namespace std;

    Stack st;
    char ch;
    unsigned long po;
    cout << "Please enter A to add a purchase order, \nP to process a PO, or Q to quit.\n";
    //  toupper = to upper case
    while(cin >> ch && toupper(ch) != 'Q') {
        //  接下来的一个字符是换行符，才做后面的操作
        while(cin.get() != '\n') {
            continue;
        }
        //  is alphabetic, 是否是字母
        if (!isalpha(ch)) {
            cout << '\a';
            continue;
        }
        switch(ch) {
            case 'A':
            case 'a':
                cout << "Enter a PO number to add: ";
                cin >> po;
                cout << "You entered: " << po << "\n";
                if (st.is_full()) {
                    cout << "Stack already full.\n";
                } else {
                    //  推入栈
                    st.push(po);
                }
                break;
            case 'p':
            case 'P':
                if (st.is_empty()) {
                    cout << "Stack already cleared.\n";
                } else {
                    st.pop(po);
                    cout << "Po #" << po << " processed.\n";
                }
                break;
        }
        cout << "Please enter A to add a purchase order, \nP to process a PO, or Q to quit.\n";
    }
    cout << "Bye!\n";
}